

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O3

char * __thiscall NaVector::get_string(NaVector *this,char *szBuf,char *szDelim)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  int iVar4;
  uint uVar5;
  double dVar6;
  char *szNext;
  char *local_38;
  
  cVar1 = *szBuf;
  while( true ) {
    iVar4 = (int)cVar1;
    iVar2 = isspace(iVar4);
    if (((iVar4 == 0) || (iVar2 == 0)) || (pcVar3 = strchr(szDelim,iVar4), pcVar3 == (char *)0x0))
    break;
    cVar1 = szBuf[1];
    szBuf = szBuf + 1;
  }
  (*this->_vptr_NaVector[4])(this,0);
  uVar5 = 0;
  do {
    cVar1 = *szBuf;
    while( true ) {
      iVar4 = (int)cVar1;
      iVar2 = isspace(iVar4);
      if ((iVar4 == 0) || (iVar2 == 0)) break;
      pcVar3 = strchr(szDelim,iVar4);
      if (pcVar3 == (char *)0x0) goto LAB_00155109;
      cVar1 = szBuf[1];
      szBuf = szBuf + 1;
    }
    if (iVar4 == 0) {
      return szBuf;
    }
LAB_00155109:
    pcVar3 = strchr(szDelim,iVar4);
    if (pcVar3 != (char *)0x0) {
      return szBuf;
    }
    dVar6 = strtod(szBuf,&local_38);
    pcVar3 = local_38;
    if (local_38 == szBuf) {
      return szBuf;
    }
    (*this->_vptr_NaVector[4])(this,(ulong)(uVar5 + 1));
    iVar2 = (*this->_vptr_NaVector[7])(this,(ulong)uVar5);
    *(double *)CONCAT44(extraout_var,iVar2) = dVar6;
    szBuf = pcVar3;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

const char*
NaVector::get_string (const char* szBuf, const char* szDelim)
{
    const char  *szPtr = szBuf;
    char        *szNext;
    unsigned    i;

    // skip leading spaces
    while(isspace(*szPtr) && *szPtr != '\0' &&
          NULL != strchr(szDelim, *szPtr))
        ++szPtr;

    new_dim(0);

    for(i = 0; ; ++i){
        //??? Strange things: szPtr value differs from (4) to (1) 
        //???NaPrintLog("get_string(1): szPtr='%s'(%p)\n", szPtr, szPtr);

        // skip leading spaces
        while(isspace(*szPtr) && *szPtr != '\0' &&
              NULL != strchr(szDelim, *szPtr))
            ++szPtr;

        //???NaPrintLog("get_string(2): szPtr='%s'(%p)\n", szPtr, szPtr);

        // while current string is not a delimiter and is not EOS...
        if('\0' == *szPtr || NULL != strchr(szDelim, *szPtr))
            break;

        // read number
        NaReal  fVal = strtod(szPtr, &szNext);
        //???NaPrintLog("get_string(): '%s' -> %g, next is '%s'\n",
        //???           szPtr, fVal, szNext);

        if(szNext == szPtr){
            // error while reading
            return szPtr;
        }
        szPtr = szNext;
        //???NaPrintLog("get_string(3): szPtr='%s'(%p)\n", szPtr, szPtr);

        new_dim(i + 1);
        fetch(i) = fVal;

        //???NaPrintLog("get_string(4): szPtr='%s'(%p)\n", szPtr, szPtr);
    }

    return szPtr;
}